

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

void htmlCheckMeta(htmlParserCtxtPtr ctxt,xmlChar **atts)

{
  xmlChar *str1;
  bool bVar1;
  int iVar2;
  int iVar3;
  xmlChar *local_40;
  xmlChar *content;
  int http;
  xmlChar *value;
  xmlChar *att;
  int i;
  xmlChar **atts_local;
  htmlParserCtxtPtr ctxt_local;
  
  bVar1 = false;
  local_40 = (xmlChar *)0x0;
  if ((ctxt != (htmlParserCtxtPtr)0x0) && (atts != (xmlChar **)0x0)) {
    att._4_4_ = 1;
    value = *atts;
    while (value != (xmlChar *)0x0) {
      iVar3 = att._4_4_ + 1;
      str1 = atts[att._4_4_];
      if (((str1 == (xmlChar *)0x0) ||
          (iVar2 = xmlStrcasecmp(value,(xmlChar *)"http-equiv"), iVar2 != 0)) ||
         (iVar2 = xmlStrcasecmp(str1,(xmlChar *)"Content-Type"), iVar2 != 0)) {
        if ((str1 == (xmlChar *)0x0) || (iVar2 = xmlStrcasecmp(value,"charset"), iVar2 != 0)) {
          if ((str1 != (xmlChar *)0x0) && (iVar2 = xmlStrcasecmp(value,"content"), iVar2 == 0)) {
            local_40 = str1;
          }
        }
        else {
          htmlCheckEncodingDirect(ctxt,str1);
        }
      }
      else {
        bVar1 = true;
      }
      att._4_4_ = att._4_4_ + 2;
      value = atts[iVar3];
    }
    if ((bVar1) && (local_40 != (xmlChar *)0x0)) {
      htmlCheckEncoding(ctxt,local_40);
    }
  }
  return;
}

Assistant:

static void
htmlCheckMeta(htmlParserCtxtPtr ctxt, const xmlChar **atts) {
    int i;
    const xmlChar *att, *value;
    int http = 0;
    const xmlChar *content = NULL;

    if ((ctxt == NULL) || (atts == NULL))
	return;

    i = 0;
    att = atts[i++];
    while (att != NULL) {
	value = atts[i++];
	if ((value != NULL) && (!xmlStrcasecmp(att, BAD_CAST"http-equiv"))
	 && (!xmlStrcasecmp(value, BAD_CAST"Content-Type")))
	    http = 1;
	else if ((value != NULL) && (!xmlStrcasecmp(att, BAD_CAST"charset")))
	    htmlCheckEncodingDirect(ctxt, value);
	else if ((value != NULL) && (!xmlStrcasecmp(att, BAD_CAST"content")))
	    content = value;
	att = atts[i++];
    }
    if ((http) && (content != NULL))
	htmlCheckEncoding(ctxt, content);

}